

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fid_cgap.h
# Opt level: O2

double __thiscall bwtil::fid_cgap::entropy(fid_cgap *this)

{
  _Rb_tree_header *p_Var1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  mapped_type *pmVar5;
  _Base_ptr p_Var6;
  ulint i;
  ulong i_00;
  undefined1 in_ZMM0 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [16];
  undefined1 in_XMM2 [16];
  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  freqs;
  double local_78;
  ulint local_60;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  local_58;
  undefined1 extraout_var [56];
  
  p_Var1 = &local_58._M_impl.super__Rb_tree_header;
  local_58._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_58._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_58._M_impl.super__Rb_tree_header._M_node_count = 0;
  i_00 = 0;
  local_58._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_58._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  for (; i_00 < this->n; i_00 = i_00 + 1) {
    local_60 = gapAt(this,i_00);
    pmVar5 = std::
             map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
             ::operator[]((map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                           *)&local_58,&local_60);
    *pmVar5 = *pmVar5 + 1;
  }
  auVar3 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,this->n);
  local_78 = 0.0;
  for (p_Var6 = local_58._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 != p_Var1; p_Var6 = (_Base_ptr)::std::_Rb_tree_increment(p_Var6)) {
    auVar4 = vcvtusi2sd_avx512f(in_XMM2,p_Var6[1]._M_parent);
    auVar7._0_8_ = log2(auVar3._0_8_ / auVar4._0_8_);
    auVar7._8_56_ = extraout_var;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = local_78;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = auVar4._0_8_;
    auVar2 = vfmadd231sd_fma(auVar8,auVar7._0_16_,auVar2);
    local_78 = auVar2._0_8_;
  }
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  ::~_Rb_tree(&local_58);
  return local_78 / auVar3._0_8_;
}

Assistant:

double entropy(){

		double H=0;
		map<ulint,ulint> freqs;

		for(ulint i=0;i<n;++i)
			freqs[gapAt(i)]++;

		for(auto f : freqs)
			H += f.second * log2((double)n/(double)f.second);

		return H/n;

	}